

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O1

Object<(anonymous_namespace)::RootPresets> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>
::BindPrivate(Object<(anonymous_namespace)::RootPresets> *this,string_view *name,
             MemberFunction *func,bool required)

{
  pointer *ppMVar1;
  undefined8 *puVar2;
  _Manager_type p_Var3;
  pointer pMVar4;
  pointer pMVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  size_t sVar9;
  char *pcVar10;
  _func_ReadFileResult__Any_data_ptr_RootPresets_ptr_Value_ptr_ptr *__tmp;
  ulong uVar11;
  pointer pMVar12;
  ulong uVar13;
  _Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
  *this_00;
  pointer pMVar14;
  long lVar15;
  pointer pMVar16;
  void *local_88;
  undefined8 uStack_80;
  _Manager_type local_78;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  undefined1 local_38;
  
  sVar9 = name->_M_len;
  pcVar10 = name->_M_str;
  local_88 = (void *)0x0;
  uStack_80 = 0;
  local_78 = (_Manager_type)0x0;
  p_Stack_40 = func->_M_invoker;
  p_Var3 = (func->super__Function_base)._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    local_88 = *(void **)&(func->super__Function_base)._M_functor;
    uStack_80 = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    (func->super__Function_base)._M_manager = (_Manager_type)0x0;
    func->_M_invoker = (_Invoker_type)0x0;
    local_78 = p_Var3;
  }
  local_48 = local_78;
  local_58._8_8_ = uStack_80;
  local_58._M_unused._M_object = local_88;
  pMVar4 = (this->Members).
           super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = required;
  if (pMVar4 == (this->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pMVar5 = (this->Members).
             super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar15 = (long)pMVar4 - (long)pMVar5;
    if (lVar15 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar13 = (lVar15 >> 3) * 0x6db6db6db6db6db7;
    uVar11 = 1;
    if (pMVar4 != pMVar5) {
      uVar11 = uVar13;
    }
    this_00 = (_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
               *)(uVar11 + uVar13);
    if ((_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
         *)0x249249249249248 < this_00) {
      this_00 = (_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
                 *)0x249249249249249;
    }
    if (CARRY8(uVar11,uVar13)) {
      this_00 = (_Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
                 *)0x249249249249249;
    }
    pMVar12 = std::
              _Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
              ::_M_allocate(this_00,0);
    *(size_t *)((long)pMVar12 + lVar15) = sVar9;
    ((size_t *)((long)pMVar12 + lVar15))[1] = (size_t)pcVar10;
    puVar2 = (undefined8 *)((long)pMVar12 + lVar15 + 0x10);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)((long)pMVar12 + lVar15 + 0x20) = 0;
    *(_Invoker_type *)((long)pMVar12 + lVar15 + 0x28) = p_Stack_40;
    if (local_48 != (_Manager_type)0x0) {
      *(void **)((long)pMVar12 + lVar15 + 0x10) = local_58._M_unused._M_object;
      *(undefined8 *)((long)pMVar12 + lVar15 + 0x18) = local_58._8_8_;
      *(_Manager_type *)((long)pMVar12 + lVar15 + 0x20) = local_48;
      local_48 = (_Manager_type)0x0;
      p_Stack_40 = (_Invoker_type)0x0;
    }
    *(undefined1 *)((long)pMVar12 + lVar15 + 0x30) = local_38;
    pMVar14 = pMVar12;
    for (pMVar16 = pMVar5; pMVar4 != pMVar16; pMVar16 = pMVar16 + 1) {
      uVar6 = *(undefined4 *)((long)&(pMVar16->Name)._M_len + 4);
      uVar7 = *(undefined4 *)&(pMVar16->Name)._M_str;
      uVar8 = *(undefined4 *)((long)&(pMVar16->Name)._M_str + 4);
      *(int *)&(pMVar14->Name)._M_len = (int)(pMVar16->Name)._M_len;
      *(undefined4 *)((long)&(pMVar14->Name)._M_len + 4) = uVar6;
      *(undefined4 *)&(pMVar14->Name)._M_str = uVar7;
      *(undefined4 *)((long)&(pMVar14->Name)._M_str + 4) = uVar8;
      *(undefined8 *)&(pMVar14->Function).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(pMVar14->Function).super__Function_base._M_functor + 8) = 0;
      (pMVar14->Function).super__Function_base._M_manager = (_Manager_type)0x0;
      (pMVar14->Function)._M_invoker = (pMVar16->Function)._M_invoker;
      p_Var3 = (pMVar16->Function).super__Function_base._M_manager;
      if (p_Var3 != (_Manager_type)0x0) {
        uVar6 = *(undefined4 *)((long)&(pMVar16->Function).super__Function_base._M_functor + 4);
        uVar7 = *(undefined4 *)((long)&(pMVar16->Function).super__Function_base._M_functor + 8);
        uVar8 = *(undefined4 *)((long)&(pMVar16->Function).super__Function_base._M_functor + 0xc);
        *(undefined4 *)&(pMVar14->Function).super__Function_base._M_functor =
             *(undefined4 *)&(pMVar16->Function).super__Function_base._M_functor;
        *(undefined4 *)((long)&(pMVar14->Function).super__Function_base._M_functor + 4) = uVar6;
        *(undefined4 *)((long)&(pMVar14->Function).super__Function_base._M_functor + 8) = uVar7;
        *(undefined4 *)((long)&(pMVar14->Function).super__Function_base._M_functor + 0xc) = uVar8;
        (pMVar14->Function).super__Function_base._M_manager = p_Var3;
        (pMVar16->Function).super__Function_base._M_manager = (_Manager_type)0x0;
        (pMVar16->Function)._M_invoker = (_Invoker_type)0x0;
      }
      pMVar14->Required = pMVar16->Required;
      p_Var3 = (pMVar16->Function).super__Function_base._M_manager;
      if (p_Var3 != (_Manager_type)0x0) {
        (*p_Var3)((_Any_data *)&pMVar16->Function,(_Any_data *)&pMVar16->Function,__destroy_functor)
        ;
      }
      pMVar14 = pMVar14 + 1;
    }
    if (pMVar5 != (pointer)0x0) {
      operator_delete(pMVar5,(long)(this->Members).
                                   super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar5
                     );
    }
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar12;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar14 + 1;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar12 + (long)this_00;
  }
  else {
    (pMVar4->Name)._M_len = sVar9;
    (pMVar4->Name)._M_str = pcVar10;
    *(undefined8 *)&(pMVar4->Function).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pMVar4->Function).super__Function_base._M_functor + 8) = 0;
    (pMVar4->Function).super__Function_base._M_manager = (_Manager_type)0x0;
    (pMVar4->Function)._M_invoker = p_Stack_40;
    if (local_78 != (_Manager_type)0x0) {
      *(void **)&(pMVar4->Function).super__Function_base._M_functor = local_88;
      *(undefined8 *)((long)&(pMVar4->Function).super__Function_base._M_functor + 8) = uStack_80;
      (pMVar4->Function).super__Function_base._M_manager = local_78;
      local_48 = (_Manager_type)0x0;
      p_Stack_40 = (_Invoker_type)0x0;
    }
    pMVar4->Required = required;
    ppMVar1 = &(this->Members).
               super__Vector_base<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<(anonymous_namespace)::RootPresets>::Member>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  if (required) {
    this->AnyRequired = true;
  }
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return this;
}

Assistant:

Object& BindPrivate(const cm::string_view& name, MemberFunction&& func,
                        bool required)
    {
      Member m;
      m.Name = name;
      m.Function = std::move(func);
      m.Required = required;
      this->Members.push_back(std::move(m));
      if (required) {
        this->AnyRequired = true;
      }
      return *this;
    }